

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readRgbaFILE.cpp
# Opt level: O0

void readRgbaFILE(FILE *cfile,char *fileName,Array2D<Imf_3_4::Rgba> *pixels,int *width,int *height)

{
  int iVar1;
  Box<Imath_3_2::Vec2<int>_> *this;
  Rgba *pRVar2;
  int *in_RCX;
  Array2D<Imf_3_4::Rgba> *in_RDX;
  int *in_R8;
  Box2i dw;
  RgbaInputFile file;
  C_IStream istr;
  Box<Imath_3_2::Vec2<int>_> *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  int local_a8;
  Rgba local_98 [5];
  long in_stack_ffffffffffffff90;
  long in_stack_ffffffffffffff98;
  Array2D<Imf_3_4::Rgba> *in_stack_ffffffffffffffa0;
  IStream local_58 [48];
  int *local_28;
  int *local_20;
  Array2D<Imf_3_4::Rgba> *local_18;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  C_IStream::C_IStream
            ((C_IStream *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (FILE *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
             in_stack_ffffffffffffff40);
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_98,local_58,iVar1);
  this = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::RgbaInputFile::dataWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box(this,in_stack_ffffffffffffff38);
  *local_20 = (in_stack_ffffffffffffff54 - in_stack_ffffffffffffff4c) + 1;
  *local_28 = (local_a8 - in_stack_ffffffffffffff50) + 1;
  Imf_3_4::Array2D<Imf_3_4::Rgba>::resizeErase
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  pRVar2 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](local_18,0);
  Imf_3_4::RgbaInputFile::setFrameBuffer
            (local_98,(ulong)(pRVar2 + (-(long)in_stack_ffffffffffffff4c -
                                       (long)(in_stack_ffffffffffffff50 * *local_20))),1);
  Imf_3_4::RgbaInputFile::readPixels((int)local_98,in_stack_ffffffffffffff50);
  Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_98);
  C_IStream::~C_IStream((C_IStream *)0x109407);
  return;
}

Assistant:

void
readRgbaFILE (
    FILE*          cfile,
    const char     fileName[],
    Array2D<Rgba>& pixels,
    int&           width,
    int&           height)
{
    C_IStream istr (cfile, fileName);

    RgbaInputFile file (istr);

    Box2i dw = file.dataWindow ();

    width  = dw.max.x - dw.min.x + 1;
    height = dw.max.y - dw.min.y + 1;
    pixels.resizeErase (height, width);

    file.setFrameBuffer (&pixels[0][0] - dw.min.x - dw.min.y * width, 1, width);

    file.readPixels (dw.min.y, dw.max.y);
}